

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BP4Deserializer.cpp
# Opt level: O2

void __thiscall adios2::format::BP4Deserializer::BP4Deserializer(BP4Deserializer *this,Comm *comm)

{
  _Rb_tree_header *p_Var1;
  
  BPBase::BPBase((BPBase *)&this->field_0x128,comm);
  BP4Base::BP4Base((BP4Base *)&this->field_0x88,&PTR_construction_vtable_40__0081cbc0,comm);
  this->_vptr_BP4Deserializer = (_func_int **)0x81cb20;
  *(undefined8 *)&this->field_0x88 = 0x81cb58;
  *(undefined8 *)&this->field_0x128 = 0x81cb90;
  BPBase::Minifooter::Minifooter(&this->m_Minifooter,'\x04');
  this->m_WriterIsActive = false;
  this->m_PerformedGets = false;
  p_Var1 = &(this->m_DeferredVariablesMap)._M_t._M_impl.super__Rb_tree_header;
  (this->m_DeferredVariablesMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_DeferredVariablesMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->m_DeferredVariablesMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->m_DeferredVariablesMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->m_DeferredVariablesMap)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  return;
}

Assistant:

BP4Deserializer::BP4Deserializer(helper::Comm const &comm)
: BPBase(comm), BP4Base(comm), m_Minifooter(4)
{
}